

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsLib.cpp
# Opt level: O2

long AdsSyncWriteControlReqEx
               (long port,AmsAddr *pAddr,uint16_t adsState,uint16_t devState,uint32_t bufferLength,
               void *buffer)

{
  long lVar1;
  AdsWriteCtrlRequest local_78;
  AmsRequest request;
  
  lVar1 = 0x748;
  if (0xffffffffffff0000 < port - 0x10000U) {
    if (pAddr == (AmsAddr *)0x0) {
      lVar1 = 0x749;
    }
    else {
      AmsRequest::AmsRequest
                (&request,pAddr,(uint16_t)port,5,0,(void *)0x0,(uint32_t *)0x0,
                 (ulong)bufferLength + 8);
      Frame::prepend(&request.frame,buffer,(ulong)bufferLength);
      local_78.leAdsState = adsState;
      local_78.leDevState = devState;
      local_78.leLength = bufferLength;
      Frame::prepend<AdsWriteCtrlRequest>(&request.frame,&local_78);
      GetRouter();
      lVar1 = AmsRouter::AdsRequest(&GetRouter::router,&request);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&request);
    }
  }
  return lVar1;
}

Assistant:

long AdsSyncWriteControlReqEx(long           port,
                              const AmsAddr* pAddr,
                              uint16_t       adsState,
                              uint16_t       devState,
                              uint32_t       bufferLength,
                              const void*    buffer)
{
    ASSERT_PORT_AND_AMSADDR(port, pAddr);
    try {
        AmsRequest request {
            *pAddr,
            (uint16_t)port,
            AoEHeader::WRITE_CONTROL,
            0, nullptr, nullptr,
            sizeof(AdsWriteCtrlRequest) + bufferLength
        };
        request.frame.prepend(buffer, bufferLength);
        request.frame.prepend<AdsWriteCtrlRequest>({
            adsState,
            devState,
            bufferLength
        });
        return GetRouter().AdsRequest(request);
    } catch (const std::bad_alloc&) {
        return GLOBALERR_NO_MEMORY;
    }
}